

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v8::detail::format_uint<1u,char,unsigned__int128>
                 (char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  int in_ECX;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  ulong uStack_38;
  int num_digits_local;
  unsigned___int128 value_local;
  char *local_20;
  char *buffer_local;
  
  uStack_38 = CONCAT44(in_register_00000034,num_digits);
  value_local._0_8_ = CONCAT71(in_register_00000011,upper);
  local_20 = buffer + in_ECX;
  do {
    local_20[-1] = ((byte)uStack_38 & 1) + 0x30;
    uStack_38 = (ulong)value_local << 0x3f | uStack_38 >> 1;
    value_local._0_8_ = (ulong)value_local >> 1;
    local_20 = local_20 + -1;
  } while (uStack_38 != 0 || (ulong)value_local != 0);
  return buffer + in_ECX;
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}